

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O3

void generate_license(string *fname,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *other_args)

{
  pointer pbVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  SI_Error SVar5;
  long lVar6;
  char **argv;
  ulong uVar7;
  pointer pbVar8;
  ulong uVar9;
  int sectionSize;
  undefined8 local_1a0;
  SI_Error *local_198;
  SI_Error rc;
  undefined **local_188;
  undefined1 local_180;
  undefined1 *local_178;
  SI_Error **local_170;
  undefined **local_168;
  undefined1 local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  shared_count sStack_138;
  undefined4 local_130;
  int retCode;
  int *local_128;
  char *local_120;
  undefined **local_118;
  ulong local_110;
  shared_count sStack_108;
  char *local_100;
  undefined1 local_f8 [32];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  _List_node_base local_b0;
  undefined7 local_a0;
  undefined4 uStack_99;
  bool local_95;
  int local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  pbVar8 = (other_args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (other_args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pbVar1 - (long)pbVar8;
  uVar9 = lVar6 >> 5;
  lVar6 = lVar6 * 0x8000000 + 0x500000000;
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar7 = lVar6 >> 0x1d;
  }
  argv = (char **)operator_new__(uVar7);
  *argv = "lic-generator";
  if (pbVar1 == pbVar8) {
    uVar7 = 1;
    uVar3 = 1;
  }
  else {
    uVar7 = 1;
    do {
      argv[uVar7] = (pbVar8->_M_dataplus)._M_p;
      uVar3 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar3;
      pbVar8 = pbVar8 + 1;
    } while (uVar7 <= uVar9);
  }
  argv[uVar7] = "-o";
  argv[uVar3 + 1] = (fname->_M_dataplus)._M_p;
  argv[uVar3 + 2] = "TEST";
  iVar4 = license::LicenseGenerator::generateLicense((int)uVar9 + 4,argv);
  retCode = iVar4;
  operator_delete__(argv);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x20);
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_00627578;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_198 = (SI_Error *)&local_1a0;
  local_1a0 = (int *)((ulong)local_1a0._4_4_ << 0x20);
  local_118 = (undefined **)CONCAT71(local_118._1_7_,iVar4 == 0);
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_140 = "";
  local_f8._24_8_ = &local_128;
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_00627708;
  local_f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_170 = &local_198;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_00627708;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_128 = &retCode;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_108);
  pcVar2 = (fname->_M_dataplus)._M_p;
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,pcVar2,pcVar2 + fname->_M_string_length);
  boost::filesystem::detail::status((detail *)&local_188,(path *)local_f8,(error_code *)0x0);
  if ((uint)local_188 < 2) {
    __assert_fail("fs::exists(fname)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                  ,0x21,"void generate_license(const string &, const vector<string> &)");
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  local_d8._M_left = &local_d8;
  local_d8._M_color = _S_red;
  local_d8._M_parent = (_Base_ptr)0x0;
  local_f8._0_8_ = (char *)0x0;
  local_f8._8_8_ = 0;
  local_f8._16_8_ = (char *)0x0;
  local_b8 = 0;
  local_b0._M_next = &local_b0;
  local_a0 = 0;
  uStack_99 = 0;
  local_95 = true;
  local_94 = 0;
  local_d8._M_right = local_d8._M_left;
  local_b0._M_prev = local_b0._M_next;
  SVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_f8,
                     (fname->_M_dataplus)._M_p);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  rc = SVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x24);
  local_110 = local_110 & 0xffffffffffffff00;
  local_118 = &PTR__lazy_ostream_00627578;
  sStack_108.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_1a0 = &sectionSize;
  sectionSize = 0;
  local_140 = (char *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_128 = (int *)0x4eeb1e;
  local_120 = "";
  local_198 = &rc;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_00627748;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = &local_198;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_00627708;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)&local_1a0;
  local_148._0_1_ = SI_FAIL < SVar5;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  iVar4 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_f8,
                     "TEST");
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  sectionSize = iVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x26);
  local_110 = local_110 & 0xffffffffffffff00;
  local_118 = &PTR__lazy_ostream_00627578;
  sStack_108.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_1a0 = &local_130;
  local_148 = (char *)CONCAT71(local_148._1_7_,0 < iVar4);
  local_130 = 0;
  local_140 = (char *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_128 = (int *)0x4eeb1e;
  local_120 = "";
  local_198 = &sectionSize;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_00627708;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_170 = &local_198;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_00627708;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)&local_1a0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_f8);
  return;
}

Assistant:

void generate_license(const string& fname, const vector<string>& other_args) {
	int argc = 4+other_args.size();
	const char** argv = new const char*[argc + 1];
	unsigned int i=0;
	argv[i++] = "lic-generator";
	for(;i<=other_args.size();i++){
		argv[i] = other_args[i-1].c_str();
	}
	argv[i++] = "-o";
	argv[i++] = fname.c_str();
	argv[i++] = "TEST";
	int retCode = LicenseGenerator::generateLicense(argc, argv);
	delete[] (argv);
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(fname));
	CSimpleIniA ini;
	SI_Error rc = ini.LoadFile(fname.c_str());
	BOOST_CHECK_GE(rc,0);
	int sectionSize = ini.GetSectionSize("TEST");
	BOOST_CHECK_GT(sectionSize,0);
}